

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

void __thiscall Minisat::StringOption::printOptionCall(StringOption *this,stringstream *s)

{
  ostream *poVar1;
  long in_RSI;
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x30) == 0) {
    poVar1 = std::operator<<((ostream *)(in_RSI + 0x10),"-");
    poVar1 = std::operator<<(poVar1,*(char **)(in_RDI + 8));
    std::operator<<(poVar1,"=\"\"");
  }
  else {
    poVar1 = std::operator<<((ostream *)(in_RSI + 0x10),"-");
    poVar1 = std::operator<<(poVar1,*(char **)(in_RDI + 8));
    poVar1 = std::operator<<(poVar1,"=");
    std::operator<<(poVar1,*(string **)(in_RDI + 0x30));
  }
  return;
}

Assistant:

virtual void printOptionCall(std::stringstream &s)
    {
        if (value != NULL) {
            s << "-" << name << "=" << *value;
        } else {
            s << "-" << name << "=\"\"";
        }
    }